

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_NtkBalanceMux(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize,
                      int nGroups,int nMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  Str_Obj_t *pSVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  if (0 < nGroups) {
    iVar9 = 0;
    do {
      iVar7 = Str_MuxRestructure(pNew,p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 4),nMuxes,
                                 vDelay,nLutSize,fRecursive,fOptArea,fVerbose);
      if (iVar7 == -1) {
        iVar7 = nMuxes;
        if (0 < nMuxes) {
          do {
            uVar8 = pObj->iOffset;
            if ((long)(int)uVar8 < -2) {
LAB_007d4bfc:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar1 = (p->vFanins).nSize;
            if ((int)uVar1 <= (int)(uVar8 + 2)) goto LAB_007d4bfc;
            piVar5 = (p->vFanins).pArray;
            uVar2 = piVar5[uVar8 + 2];
            if ((int)uVar2 < 0) goto LAB_007d4c1b;
            uVar3 = p->nObjs;
            if ((int)uVar3 <= (int)(uVar2 >> 1)) {
LAB_007d4c59:
              __assert_fail("i < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                            ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
            }
            pSVar6 = p->pObjs;
            if (pSVar6[uVar2 >> 1].iCopy < 0) {
LAB_007d4c3a:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            if (uVar1 <= uVar8 + 1) goto LAB_007d4bfc;
            uVar4 = piVar5[uVar8 + 1];
            if ((int)uVar4 < 0) goto LAB_007d4c1b;
            if (uVar3 <= uVar4 >> 1) goto LAB_007d4c59;
            if (pSVar6[uVar4 >> 1].iCopy < 0) goto LAB_007d4c3a;
            if (((int)uVar8 < 0) || (uVar1 <= uVar8)) goto LAB_007d4bfc;
            uVar8 = piVar5[(int)uVar8];
            if ((int)uVar8 < 0) {
LAB_007d4c1b:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (uVar3 <= uVar8 >> 1) goto LAB_007d4c59;
            if (pSVar6[uVar8 >> 1].iCopy < 0) goto LAB_007d4c3a;
            uVar8 = Gia_ManHashMuxReal(pNew,pSVar6[uVar2 >> 1].iCopy ^ uVar2 & 1,
                                       pSVar6[uVar4 >> 1].iCopy ^ uVar4 & 1,
                                       pSVar6[uVar8 >> 1].iCopy ^ uVar8 & 1);
            pObj->iCopy = uVar8;
            if ((int)uVar8 < 0) goto LAB_007d4c1b;
            Str_ObjDelay(pNew,uVar8 >> 1,nLutSize,vDelay);
            pObj = pObj + 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      else {
        pObj[nMuxes + -1].iCopy = iVar7;
        pObj = pObj + (long)(nMuxes + -1) + 1;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != nGroups);
  }
  return;
}

Assistant:

void Str_NtkBalanceMux( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize, int nGroups, int nMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    extern int Str_MuxRestructure( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fRecursive, int fOptArea, int fVerbose );
    int n, m, iRes, fUseRestruct = 1;
    if ( fUseRestruct )
    {
        for ( n = 0; n < nGroups; n++ )
        {            
            iRes = Str_MuxRestructure( pNew, p, Str_ObjId(p, pObj), nMuxes, vDelay, nLutSize, fRecursive, fOptArea, fVerbose );
            if ( iRes == -1 )
            {
                for ( m = 0; m < nMuxes; m++, pObj++ )
                {
                    pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
                    Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
                }
            }
            else
            {
                pObj += nMuxes - 1;
                pObj->iCopy = iRes;
                pObj++;
            }
        }
    }
    else
    {
        for ( n = 0; n < nGroups * nMuxes; n++, pObj++ )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
    }
}